

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.h
# Opt level: O0

void sha3_256(void *key,int len,uint32_t seed,void *out)

{
  unsigned_long in_RCX;
  uint in_EDX;
  undefined4 in_ESI;
  hash_state *in_RDI;
  uchar buf [32];
  uchar *in_stack_ffffffffffffffd8;
  hash_state *in_stack_ffffffffffffffe0;
  
  sha3_256_init((hash_state *)0x1118e2);
  ltc_state.whirlpool.state[0] = (ulong)in_EDX ^ 1;
  sha3_process(in_RDI,(uchar *)CONCAT44(in_ESI,in_EDX),in_RCX);
  sha3_done(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

inline void sha3_256(const void *key, int len, uint32_t seed, void *out)
{
  // objsize
  unsigned char buf[32];
  sha3_256_init(&ltc_state);
  ltc_state.sha3.s[0] = CONST64(1) ^ seed;
  sha3_process(&ltc_state, (unsigned char *)key, len);
  sha3_done(&ltc_state, (unsigned char *)out);
}